

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

int uss_dirhandle_cmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*bv <= *av) {
    uVar1 = (uint)(*bv < *av);
  }
  return uVar1;
}

Assistant:

static int uss_dirhandle_cmp(void *av, void *bv)
{
    struct uss_dirhandle *a = (struct uss_dirhandle *)av;
    struct uss_dirhandle *b = (struct uss_dirhandle *)bv;
    if (a->index < b->index)
        return -1;
    if (a->index > b->index)
        return +1;
    return 0;
}